

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparators.cpp
# Opt level: O3

int duckdb::Comparators::TemplatedCompareVal<duckdb::string_t>
              (data_ptr_t *left_ptr,data_ptr_t *right_ptr)

{
  bool bVar1;
  uint uVar2;
  string_t right_val;
  string_t left_val;
  anon_union_16_2_67f50693_for_value local_20;
  anon_union_16_2_67f50693_for_value local_10;
  
  local_10._0_8_ = *(undefined8 *)*left_ptr;
  local_10.pointer.ptr = (char *)*(undefined8 *)(*left_ptr + 8);
  local_20._0_8_ = *(undefined8 *)*right_ptr;
  local_20.pointer.ptr = (char *)*(undefined8 *)(*right_ptr + 8);
  bVar1 = string_t::operator==((string_t *)&local_10.pointer,(string_t *)&local_20.pointer);
  uVar2 = 0;
  if (!bVar1) {
    bVar1 = string_t::StringComparisonOperators::GreaterThan
                      ((string_t *)&local_20.pointer,(string_t *)&local_10.pointer);
    uVar2 = -(uint)bVar1 | 1;
  }
  return uVar2;
}

Assistant:

int Comparators::TemplatedCompareVal(const data_ptr_t &left_ptr, const data_ptr_t &right_ptr) {
	const auto left_val = Load<T>(left_ptr);
	const auto right_val = Load<T>(right_ptr);
	if (Equals::Operation<T>(left_val, right_val)) {
		return 0;
	} else if (LessThan::Operation<T>(left_val, right_val)) {
		return -1;
	} else {
		return 1;
	}
}